

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

void __thiscall
flatbuffers::dart::DartGenerator::DartGenerator
          (DartGenerator *this,Parser *parser,string *path,string *file_name)

{
  IdlNamer *this_00;
  DartGenerator *pDVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_b91;
  allocator<char> local_b90;
  allocator<char> local_b8f;
  allocator<char> local_b8e;
  allocator<char> local_b8d;
  allocator<char> local_b8c;
  allocator<char> local_b8b;
  allocator<char> local_b8a;
  allocator_type local_b89;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_b88;
  allocator<char> local_b87;
  allocator<char> local_b86;
  allocator<char> local_b85;
  allocator<char> local_b84;
  allocator<char> local_b83;
  allocator<char> local_b82;
  allocator<char> local_b81;
  allocator<char> local_b80;
  allocator<char> local_b7f;
  allocator<char> local_b7e;
  allocator<char> local_b7d;
  allocator<char> local_b7c;
  allocator<char> local_b7b;
  allocator<char> local_b7a;
  allocator<char> local_b79;
  allocator<char> local_b78;
  allocator<char> local_b77;
  allocator<char> local_b76;
  allocator<char> local_b75;
  allocator<char> local_b74;
  allocator<char> local_b73;
  allocator<char> local_b72;
  allocator<char> local_b71;
  allocator<char> local_b70;
  allocator<char> local_b6f;
  allocator<char> local_b6e;
  allocator<char> local_b6d;
  allocator<char> local_b6c;
  allocator<char> local_b6b;
  allocator<char> local_b6a;
  allocator<char> local_b69;
  allocator<char> local_b68;
  allocator<char> local_b67;
  allocator<char> local_b66;
  allocator<char> local_b65;
  allocator<char> local_b64;
  allocator<char> local_b63;
  allocator<char> local_b62;
  allocator<char> local_b61;
  allocator<char> local_b60;
  allocator<char> local_b5f;
  allocator<char> local_b5e;
  allocator<char> local_b5d;
  allocator<char> local_b5c;
  allocator<char> local_b5b;
  allocator<char> local_b5a;
  allocator<char> local_b59;
  allocator<char> local_b58;
  allocator<char> local_b57;
  allocator<char> local_b56;
  allocator<char> local_b55;
  allocator<char> local_b54;
  allocator<char> local_b53;
  allocator<char> local_b52;
  allocator<char> local_b51;
  DartGenerator *local_b50;
  string local_b48;
  string local_b28;
  string local_b08;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ae8;
  undefined1 local_ab8 [64];
  undefined8 local_a78;
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  undefined8 local_9d0;
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  Config local_180;
  
  local_b50 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b28,"",(allocator<char> *)&local_960);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b48,".",(allocator<char> *)local_ab8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b08,"dart",&local_b91);
  pDVar1 = local_b50;
  BaseGenerator::BaseGenerator
            (&local_b50->super_BaseGenerator,parser,path,file_name,&local_b28,&local_b48,&local_b08)
  ;
  std::__cxx11::string::~string((string *)&local_b08);
  std::__cxx11::string::~string((string *)&local_b48);
  std::__cxx11::string::~string((string *)&local_b28);
  (pDVar1->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002f9ca8;
  local_ab8._0_4_ = kUpperCamel;
  local_ab8._4_4_ = kScreamingSnake;
  local_ab8._8_4_ = kLowerCamel;
  local_ab8._12_4_ = kUnknown;
  local_ab8._16_4_ = kLowerCamel;
  local_ab8._20_4_ = kLowerCamel;
  local_ab8._24_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_ab8 + 0x20),".",(allocator<char> *)&local_960);
  local_a78._0_4_ = AfterConvertingCase;
  local_a78._4_4_ = kSnake2;
  std::__cxx11::string::string<std::allocator<char>>(local_a70,".",&local_b91);
  std::__cxx11::string::string<std::allocator<char>>(local_a50,"",&local_b8a);
  std::__cxx11::string::string<std::allocator<char>>(local_a30,"T",&local_b8b);
  std::__cxx11::string::string<std::allocator<char>>(local_a10,"$",&local_b8c);
  std::__cxx11::string::string<std::allocator<char>>(local_9f0,"",&local_b8d);
  local_9d0._0_4_ = kKeep;
  local_9d0._4_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>(local_9c8,"",&local_b8e);
  std::__cxx11::string::string<std::allocator<char>>(local_9a8,"_generated",&local_b8f);
  std::__cxx11::string::string<std::allocator<char>>(local_988,".dart",&local_b90);
  WithFlagOptions(&local_180,(Config *)local_ab8,&parser->opts,path);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"abstract",&local_b91);
  std::__cxx11::string::string<std::allocator<char>>(local_940,"else",&local_b8a);
  std::__cxx11::string::string<std::allocator<char>>(local_920,"import",&local_b8b);
  std::__cxx11::string::string<std::allocator<char>>(local_900,"show",&local_b8c);
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"as",&local_b8d);
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"enum",&local_b8e);
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,"in",&local_b8f);
  std::__cxx11::string::string<std::allocator<char>>(local_880,"static",&local_b90);
  std::__cxx11::string::string<std::allocator<char>>(local_860,"assert",&local_b51);
  std::__cxx11::string::string<std::allocator<char>>(local_840,"export",&local_b52);
  std::__cxx11::string::string<std::allocator<char>>(local_820,"interface",&local_b53);
  std::__cxx11::string::string<std::allocator<char>>(local_800,"super",&local_b54);
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"async",&local_b55);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"extends",&local_b56);
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"is",&local_b57);
  std::__cxx11::string::string<std::allocator<char>>(local_780,"switch",&local_b58);
  std::__cxx11::string::string<std::allocator<char>>(local_760,"await",&local_b59);
  std::__cxx11::string::string<std::allocator<char>>(local_740,"extension",&local_b5a);
  std::__cxx11::string::string<std::allocator<char>>(local_720,"late",&local_b5b);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"sync",&local_b5c);
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"break",&local_b5d);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"external",&local_b5e);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"library",&local_b5f);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"this",&local_b60);
  std::__cxx11::string::string<std::allocator<char>>(local_660,"case",&local_b61);
  std::__cxx11::string::string<std::allocator<char>>(local_640,"factory",&local_b62);
  std::__cxx11::string::string<std::allocator<char>>(local_620,"mixin",&local_b63);
  std::__cxx11::string::string<std::allocator<char>>(local_600,"throw",&local_b64);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"catch",&local_b65);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"false",&local_b66);
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"new",&local_b67);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"true",&local_b68);
  std::__cxx11::string::string<std::allocator<char>>(local_560,"class",&local_b69);
  std::__cxx11::string::string<std::allocator<char>>(local_540,"final",&local_b6a);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"null",&local_b6b);
  std::__cxx11::string::string<std::allocator<char>>(local_500,"try",&local_b6c);
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"const",&local_b6d);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"finally",&local_b6e);
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"on",&local_b6f);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"typedef",&local_b70);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"continue",&local_b71);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"for",&local_b72);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"operator",&local_b73);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"var",&local_b74);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"covariant",&local_b75);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"Function",&local_b76);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"part",&local_b77);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"void",&local_b78);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"default",&local_b79);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"get",&local_b7a);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"required",&local_b7b);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"while",&local_b7c);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"deferred",&local_b7d);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"hide",&local_b7e);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"rethrow",&local_b7f);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"with",&local_b80);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"do",&local_b81);
  std::__cxx11::string::string<std::allocator<char>>(local_240,"if",&local_b82);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"return",&local_b83);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"yield",&local_b84);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"dynamic",&local_b85);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"implements",&local_b86);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"set",&local_b87);
  __l._M_len = 0x3f;
  __l._M_array = &local_960;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_ae8,__l,&local_b88,&local_b89);
  this_00 = &local_b50->namer_;
  lVar2 = 0x7c0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_960._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  IdlNamer::IdlNamer(this_00,&local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_ae8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_ae8);
  Namer::Config::~Config(&local_180);
  Namer::Config::~Config((Config *)local_ab8);
  return;
}

Assistant:

DartGenerator(const Parser &parser, const std::string &path,
                const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", ".", "dart"),
        namer_(WithFlagOptions(DartDefaultConfig(), parser.opts, path),
               DartKeywords()) {}